

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

Statement * inputStatement(void)

{
  TokenType TVar1;
  Token t;
  Token t_00;
  BlockType BVar2;
  BlockType BVar3;
  Statement *__ptr;
  Statement *in_RDI;
  undefined4 uVar4;
  size_t __size;
  char *unaff_R15;
  bool bVar5;
  Token h_1;
  Token h;
  char *in_stack_ffffffffffffff60;
  undefined8 in_stack_ffffffffffffff68;
  undefined8 uStack_80;
  undefined8 uStack_60;
  Token local_50;
  
  in_RDI->type = STATEMENT_INPUT;
  TVar1 = (head->value).line;
  (in_RDI->field_1).breakStatement.pos.type = TVar1;
  (in_RDI->field_1).blockStatement.blockName = BLOCK_IF;
  (in_RDI->field_1).blockStatement.statements = (Statement *)0x0;
  __size = 0x18;
  __ptr = (Statement *)0x0;
  BVar2 = BLOCK_ELSE;
  do {
    BVar3 = BVar2;
    __ptr = (Statement *)realloc(__ptr,__size);
    if (head == (TokenList *)0x0) {
LAB_001049aa:
      printf("\x1b[31m\n[Error] [Line:%d] Bad input statement!\x1b[0m",(ulong)TVar1);
      he = he + 1;
    }
    else {
      if ((head->value).type == TOKEN_STRING) {
        if (head->next == (TokenList *)0x0) {
          uStack_60._0_4_ = -1;
          uStack_60._4_4_ = 0;
        }
        else {
          uStack_60._0_4_ = (head->value).length;
          uStack_60._4_4_ = (head->value).line;
          head = head->next;
        }
        uVar4 = 0;
        t.start = (char *)in_RDI;
        t.type = (int)uStack_60;
        t._4_4_ = uStack_60._4_4_;
        t.file = in_stack_ffffffffffffff60;
        t.length = (TokenType)in_stack_ffffffffffffff68;
        t.line = SUB84(in_stack_ffffffffffffff68,4);
        unaff_R15 = stringOf(t);
      }
      else {
        if ((head == (TokenList *)0x0) || ((head->value).type != TOKEN_IDENTIFIER))
        goto LAB_001049aa;
        if (head->next == (TokenList *)0x0) {
          uStack_80._0_4_ = -1;
          uStack_80._4_4_ = 0;
          in_stack_ffffffffffffff68._0_4_ = TOKEN_ERROR;
          in_stack_ffffffffffffff68._4_4_ = 0;
        }
        else {
          in_stack_ffffffffffffff68._0_4_ = (head->value).type;
          in_stack_ffffffffffffff68._4_4_ = *(undefined4 *)&(head->value).field_0x4;
          uStack_80._0_4_ = (head->value).length;
          uStack_80._4_4_ = (head->value).line;
          head = head->next;
        }
        t_00.start = (char *)in_RDI;
        t_00.type = (int)uStack_80;
        t_00._4_4_ = uStack_80._4_4_;
        t_00.file = in_stack_ffffffffffffff60;
        t_00.length = (TokenType)in_stack_ffffffffffffff68;
        t_00.line = SUB84(in_stack_ffffffffffffff68,4);
        in_stack_ffffffffffffff60 = stringOf(t_00);
        if (head == (TokenList *)0x0) {
          bVar5 = false;
        }
        else {
          bVar5 = (head->value).type == TOKEN_COLON;
        }
        unaff_R15 = (char *)((ulong)unaff_R15 & 0xffffffff00000000);
        uVar4 = 1;
        if (bVar5) {
          if (head->next != (TokenList *)0x0) {
            head = head->next;
          }
          if (bVar5) {
            if (head == (TokenList *)0x0) {
              bVar5 = false;
            }
            else {
              bVar5 = (head->value).type == TOKEN_INT;
            }
            if (bVar5) {
              if (head->next != (TokenList *)0x0) {
                head = head->next;
              }
              if (bVar5) {
                unaff_R15 = (char *)((ulong)unaff_R15 | 1);
                goto LAB_001049f8;
              }
            }
            if (head == (TokenList *)0x0) {
              bVar5 = false;
            }
            else {
              bVar5 = (head->value).type == TOKEN_FLOAT;
            }
            if (bVar5) {
              if (head->next != (TokenList *)0x0) {
                head = head->next;
              }
              if (bVar5) {
                unaff_R15 = (char *)((ulong)unaff_R15 | 2);
                goto LAB_001049f8;
              }
            }
            printf("\x1b[31m\n[Error] [Line:%d] Bad input format specifier!\x1b[0m",(ulong)TVar1);
            he = he + 1;
          }
        }
      }
LAB_001049f8:
      *(undefined4 *)((long)__ptr + (__size - 0x18)) = uVar4;
      *(char **)((long)__ptr + (__size - 0x10)) = unaff_R15;
      *(char **)((long)__ptr + (__size - 8)) = in_stack_ffffffffffffff60;
    }
    if (head == (TokenList *)0x0) {
      bVar5 = false;
    }
    else {
      bVar5 = (head->value).type == TOKEN_COMMA;
    }
    if (!bVar5) break;
    if (head->next != (TokenList *)0x0) {
      head = head->next;
    }
    __size = __size + 0x18;
    BVar2 = BVar3 + BLOCK_ELSE;
  } while (bVar5);
  (in_RDI->field_1).blockStatement.blockName = BVar3;
  (in_RDI->field_1).blockStatement.statements = __ptr;
  consume(&local_50,TOKEN_NEWLINE,"Expected newline after Input!");
  return in_RDI;
}

Assistant:

static Statement inputStatement(){
    Statement s;
    s.type = STATEMENT_INPUT;
    debug("Parsing input statement");
    s.inputStatement.line = presentLine();
    s.inputStatement.count = 0;
    s.inputStatement.inputs = 0;
    do{
        s.inputStatement.count++;
        s.inputStatement.inputs = (Input *)reallocate(s.inputStatement.inputs, sizeof(Input) * s.inputStatement.count);
        Input i;
        if(peek() == TOKEN_STRING){
            i.type = INPUT_PROMPT;
            i.prompt = stringOf(advance());
        }
        else if(peek() == TOKEN_IDENTIFIER){
            i.type = INPUT_IDENTIFER;
            i.identifer = stringOf(advance());
            i.datatype = INPUT_ANY;
            if(match(TOKEN_COLON)){
                if(match(TOKEN_INT))
                    i.datatype = INPUT_INT;
                else if(match(TOKEN_FLOAT))
                    i.datatype = INPUT_FLOAT;
                else{
                    printf(line_error("Bad input format specifier!"), s.inputStatement.line);
                    he++;
                }
            }
        }
        else{
            printf(line_error("Bad input statement!"), s.inputStatement.line);
            he++;
            continue;
        }
        s.inputStatement.inputs[s.inputStatement.count - 1] = i;
    } while(match(TOKEN_COMMA));

    consume(TOKEN_NEWLINE, "Expected newline after Input!");
    return s;
}